

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

unsigned_long __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Inner::Get
          (Inner *this,unsigned_long defv,int level,uint k)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  uint i;
  uint k_local;
  int level_local;
  unsigned_long defv_local;
  Inner *this_local;
  
  if (level < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0xc3,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = innerIdx(level,k);
  this_local = (Inner *)defv;
  if (this->children[uVar3] != (Node *)0x0) {
    iVar4 = (*this->children[uVar3]->_vptr_Node[2])
                      (this->children[uVar3],defv,(ulong)(level - 1),(ulong)k);
    this_local = (Inner *)CONCAT44(extraout_var,iVar4);
  }
  return (unsigned_long)this_local;
}

Assistant:

V Get(V defv, int level, uint k) const override
            {
                Assert(level > 0);
                uint i = innerIdx(level--, k);
                if (children[i] == 0)
                    return defv;
                else
                    return children[i]->Get(defv, level, k);
            }